

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::lts_20240722::Mutex::UnlockSlow(Mutex *this,SynchWaitParams *waitp)

{
  char *pcVar1;
  bool bVar2;
  PerThreadSynch *pPVar3;
  byte local_771;
  PerThreadSynch *local_630;
  byte local_2e1;
  Mutex *local_2c8;
  long local_2c0;
  int64_t cycles_waited;
  int64_t now;
  int64_t max_wait_cycles;
  int64_t total_wait_cycles;
  char *absl_raw_log_internal_basename_7;
  intptr_t nv;
  char *absl_raw_log_internal_basename_6;
  char *absl_raw_log_internal_basename_5;
  PerThreadSynch *pw_walk;
  PerThreadSynch *w_walk;
  PerThreadSynch *new_h_2;
  intptr_t nv_3;
  char *absl_raw_log_internal_basename_4;
  char *absl_raw_log_internal_basename_3;
  char *absl_raw_log_internal_basename_2;
  PerThreadSynch *new_h_1;
  intptr_t nv_2;
  PerThreadSynch *h;
  intptr_t clear_1;
  PerThreadSynch *new_h;
  intptr_t new_readers;
  char *absl_raw_log_internal_basename_1;
  ulong uStack_208;
  bool do_enqueue;
  intptr_t nv_1;
  intptr_t clear;
  char *local_1f0;
  char *absl_raw_log_internal_basename;
  intptr_t wr_wait;
  PerThreadSynch *wake_list;
  PerThreadSynch *old_h;
  PerThreadSynch *pw;
  PerThreadSynch *w;
  int c;
  PerThreadSynch *local_1b0;
  intptr_t v;
  SynchWaitParams *pSStack_1a0;
  ScopedDisable disable_rescheduling;
  SynchWaitParams *waitp_local;
  Mutex *this_local;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  
  pSStack_1a0 = waitp;
  base_internal::SchedulingGuard::ScopedDisable::ScopedDisable((ScopedDisable *)((long)&v + 7));
  std::operator&(memory_order_relaxed,__memory_order_mask);
  local_1b0 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
  AssertReaderHeld(this);
  CheckForMutexCorruption((intptr_t)local_1b0,"Unlock");
  if (((ulong)local_1b0 & 0x10) != 0) {
    PostSynchEvent(this,((uint)local_1b0 & 8) >> 3 ^ 9);
  }
  w._0_4_ = 0;
  pw = (PerThreadSynch *)0x0;
  old_h = (PerThreadSynch *)0x0;
  wake_list = (PerThreadSynch *)0x0;
  wr_wait = 1;
  absl_raw_log_internal_basename = (char *)0x0;
  local_2e1 = 1;
  if ((pSStack_1a0 != (SynchWaitParams *)0x0) &&
     (local_2e1 = 1, pSStack_1a0->thread->waitp != (SynchWaitParams *)0x0)) {
    local_2e1 = pSStack_1a0->thread->suppress_fatal_errors;
  }
  if (((local_2e1 ^ 0xff) & 1) != 0) {
    local_1f0 = "mutex.cc";
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x847,"Check %s failed: %s",
               "waitp == nullptr || waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors"
               ,"detected illegal recursion into Mutex code");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x847,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
  }
LAB_0011563b:
  do {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    local_1b0 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
    if (((((ulong)local_1b0 & 8) != 0) && (((ulong)local_1b0 & 6) != 4)) &&
       (pSStack_1a0 == (SynchWaitParams *)0x0)) {
      LOCK();
      pPVar3 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
      bVar2 = local_1b0 == pPVar3;
      if (bVar2) {
        (this->mu_).super___atomic_base<long>._M_i = (ulong)local_1b0 & 0xffffffffffffffd7;
        pPVar3 = local_1b0;
      }
      UNLOCK();
      if (bVar2) {
        clear._4_4_ = 1;
        goto LAB_001180f8;
      }
LAB_00117f78:
      local_1b0 = pPVar3;
      w._0_4_ = synchronization_internal::MutexDelay((int)w,0);
      goto LAB_0011563b;
    }
    if ((((ulong)local_1b0 & 5) == 1) && (pSStack_1a0 == (SynchWaitParams *)0x0)) {
      bVar2 = ExactlyOneReader((intptr_t)local_1b0);
      nv_1 = (ulong)bVar2 | 0x100;
      LOCK();
      pPVar3 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
      bVar2 = local_1b0 == pPVar3;
      if (bVar2) {
        (this->mu_).super___atomic_base<long>._M_i = (long)local_1b0 - nv_1;
        pPVar3 = local_1b0;
      }
      UNLOCK();
      if (!bVar2) goto LAB_00117f78;
      clear._4_4_ = 1;
LAB_001180f8:
      base_internal::SchedulingGuard::ScopedDisable::~ScopedDisable((ScopedDisable *)((long)&v + 7))
      ;
      return;
    }
    pPVar3 = local_1b0;
    if (((ulong)local_1b0 & 0x40) != 0) goto LAB_00117f78;
    LOCK();
    pPVar3 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
    bVar2 = local_1b0 == pPVar3;
    if (bVar2) {
      (this->mu_).super___atomic_base<long>._M_i = (ulong)local_1b0 | 0x40;
      pPVar3 = local_1b0;
    }
    UNLOCK();
    if (!bVar2) goto LAB_00117f78;
    if (((ulong)local_1b0 & 4) == 0) {
      absl_raw_log_internal_basename_1._7_1_ = 1;
      pPVar3 = local_1b0;
      if (pSStack_1a0 == (SynchWaitParams *)0x0) {
        new_readers = (long)
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                      + 0x78;
        absl::lts_20240722::raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x864,"Check %s failed: %s","waitp != nullptr",
                   "UnlockSlow is confused");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x864,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
      }
      do {
        local_1b0 = pPVar3;
        std::operator&(memory_order_relaxed,__memory_order_mask);
        local_1b0 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
        local_630 = local_1b0;
        if (0xff < (long)local_1b0) {
          local_630 = local_1b0 + -4;
        }
        new_h = local_630;
        clear_1 = 0;
        if ((absl_raw_log_internal_basename_1._7_1_ & 1) != 0) {
          absl_raw_log_internal_basename_1._7_1_ = pSStack_1a0->cv_word == (atomic<long> *)0x0;
          clear_1 = (intptr_t)Enqueue((PerThreadSynch *)0x0,pSStack_1a0,(intptr_t)local_630,2);
        }
        h = (PerThreadSynch *)0x28;
        if ((((ulong)local_1b0 & 8) == 0) && (bVar2 = ExactlyOneReader((intptr_t)local_1b0), bVar2))
        {
          h = (PerThreadSynch *)&DAT_00000021;
        }
        if (clear_1 == 0) {
          uStack_208 = (ulong)new_h & 0xffffffffffffff00;
        }
        else {
          uStack_208 = clear_1 | 4;
        }
        uStack_208 = uStack_208 |
                     (ulong)local_1b0 & 0xff & ((ulong)h ^ 0xffffffffffffffff) & 0xffffffffffffffbf;
        LOCK();
        pPVar3 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
        bVar2 = local_1b0 == pPVar3;
        if (bVar2) {
          (this->mu_).super___atomic_base<long>._M_i = uStack_208;
          pPVar3 = local_1b0;
        }
        UNLOCK();
      } while (!bVar2);
LAB_00117f9e:
      if (wr_wait != 1) {
        max_wait_cycles = 0;
        now = 0;
        cycles_waited = base_internal::CycleClock::Now();
        do {
          if ((*(byte *)(wr_wait + 0x12) & 1) == 0) {
            local_2c0 = cycles_waited - *(long *)(*(long *)(wr_wait + 0x20) + 0x30);
            max_wait_cycles = local_2c0 + max_wait_cycles;
            if (now == 0) {
              now = local_2c0;
            }
            *(int64_t *)(*(long *)(wr_wait + 0x20) + 0x30) = cycles_waited;
            *(undefined1 *)(*(long *)(wr_wait + 0x20) + 0x38) = 1;
          }
          wr_wait = (intptr_t)Wakeup(this,(PerThreadSynch *)wr_wait);
        } while ((PerThreadSynch *)wr_wait != (PerThreadSynch *)0x1);
        if (0 < max_wait_cycles) {
          local_2c8 = this;
          base_internal::AtomicHook<void(*)(char_const*,void_const*,long)>::operator()
                    ((AtomicHook<void(*)(char_const*,void_const*,long)> *)
                     (anonymous_namespace)::mutex_tracer,(char (*) [13])"slow release",&local_2c8,
                     &max_wait_cycles);
          base_internal::AtomicHook<void(*)(long)>::operator()
                    ((AtomicHook<void(*)(long)> *)(anonymous_namespace)::submit_profile_data,
                     &max_wait_cycles);
        }
      }
      clear._4_4_ = 0;
      goto LAB_001180f8;
    }
    nv_2 = (intptr_t)GetPerThreadSynch((intptr_t)local_1b0);
    if ((((ulong)local_1b0 & 1) != 0) &&
       (0x100 < (long)(((PerThreadSynch *)nv_2)->readers & 0xffffffffffffff00U))) {
      ((PerThreadSynch *)nv_2)->readers = ((PerThreadSynch *)nv_2)->readers + -0x100;
      new_h_1 = local_1b0;
      if (pSStack_1a0 != (SynchWaitParams *)0x0) {
        absl_raw_log_internal_basename_2 =
             (char *)Enqueue((PerThreadSynch *)nv_2,pSStack_1a0,(intptr_t)local_1b0,2);
        if ((PerThreadSynch *)absl_raw_log_internal_basename_2 == (PerThreadSynch *)0x0) {
          absl_raw_log_internal_basename_3 = "mutex.cc";
          absl::lts_20240722::raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x890,"Check %s failed: %s","new_h != nullptr",
                     "waiters disappeared during Enqueue()!");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x890,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
        }
        new_h_1 = (PerThreadSynch *)
                  ((ulong)absl_raw_log_internal_basename_2 | 4 | (ulong)new_h_1 & 0xff);
      }
      pPVar3 = new_h_1;
      std::operator&(memory_order_release,__memory_order_mask);
      (this->mu_).super___atomic_base<long>._M_i = (__int_type)pPVar3;
      goto LAB_00117f9e;
    }
    local_771 = 1;
    if (wake_list != (PerThreadSynch *)0x0) {
      local_771 = ((PerThreadSynch *)nv_2)->maybe_unlocking;
    }
    if (((local_771 ^ 0xff) & 1) != 0) {
      absl_raw_log_internal_basename_4 = "mutex.cc";
      absl::lts_20240722::raw_log_internal::RawLog
                (kFatal,"mutex.cc",0x89c,"Check %s failed: %s",
                 "old_h == nullptr || h->maybe_unlocking","Mutex queue changed beneath us");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x89c,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
    }
    if ((wake_list != (PerThreadSynch *)0x0) && ((wake_list->may_skip & 1U) == 0)) {
      wake_list->may_skip = true;
      if (wake_list->skip != (PerThreadSynch *)0x0) {
        nv_3 = (long)
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
               + 0x78;
        absl::lts_20240722::raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x8a2,"Check %s failed: %s","old_h->skip == nullptr",
                   "illegal skip from head");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x8a2,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
      }
      if (((PerThreadSynch *)nv_2 != wake_list) &&
         (bVar2 = MuEquivalentWaiter(wake_list,wake_list->next), bVar2)) {
        wake_list->skip = wake_list->next;
      }
    }
    pPVar3 = local_1b0;
    if (((undefined1 *)**(long **)(*(long *)nv_2 + 0x20) == kExclusiveS) &&
       (*(long *)(*(long *)(*(long *)nv_2 + 0x20) + 8) == 0)) {
      old_h = (PerThreadSynch *)nv_2;
      pw = *(PerThreadSynch **)nv_2;
      pw->wake = true;
      absl_raw_log_internal_basename = (char *)0x20;
LAB_00117d28:
      if (old_h->next != pw) {
        nv = (long)
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
             + 0x78;
        absl::lts_20240722::raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x91b,"Check %s failed: %s","pw->next == w",
                   "pw not w\'s predecessor");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x91b,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
      }
      nv_2 = (intptr_t)DequeueAllWakeable((PerThreadSynch *)nv_2,old_h,(PerThreadSynch **)&wr_wait);
      absl_raw_log_internal_basename_7 = (char *)((ulong)local_1b0 & 0x10 | 2);
      if (pSStack_1a0 != (SynchWaitParams *)0x0) {
        nv_2 = (intptr_t)Enqueue((PerThreadSynch *)nv_2,pSStack_1a0,(intptr_t)local_1b0,2);
      }
      if (wr_wait == 1) {
        total_wait_cycles =
             (long)
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
             + 0x78;
        absl::lts_20240722::raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x932,"Check %s failed: %s","wake_list != kPerThreadSynchNull",
                   "unexpected empty wake list");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x932,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
      }
      if (nv_2 != 0) {
        *(undefined8 *)(nv_2 + 0x28) = 0;
        *(undefined1 *)(nv_2 + 0x13) = 0;
        absl_raw_log_internal_basename_7 =
             (char *)((ulong)absl_raw_log_internal_basename | 4 | nv_2 |
                     (ulong)absl_raw_log_internal_basename_7);
      }
      pcVar1 = absl_raw_log_internal_basename_7;
      std::operator&(memory_order_release,__memory_order_mask);
      (this->mu_).super___atomic_base<long>._M_i = (__int_type)pcVar1;
      goto LAB_00117f9e;
    }
    if ((pw != (PerThreadSynch *)0x0) &&
       ((pw->waitp->how == (MuHow)kExclusiveS || ((PerThreadSynch *)nv_2 == wake_list)))) {
      if (old_h == (PerThreadSynch *)0x0) {
        old_h = (PerThreadSynch *)nv_2;
      }
      goto LAB_00117d28;
    }
    if (wake_list == (PerThreadSynch *)nv_2) {
      new_h_2 = (PerThreadSynch *)((ulong)local_1b0 & 0xffffffffffffffd6);
      *(undefined8 *)(nv_2 + 0x28) = 0;
      *(undefined1 *)(nv_2 + 0x13) = 0;
      if (pSStack_1a0 != (SynchWaitParams *)0x0) {
        w_walk = Enqueue((PerThreadSynch *)nv_2,pSStack_1a0,(intptr_t)local_1b0,2);
        new_h_2 = (PerThreadSynch *)((ulong)new_h_2 & 0xff);
        if (w_walk != (PerThreadSynch *)0x0) {
          new_h_2 = (PerThreadSynch *)((ulong)w_walk | 4 | (ulong)new_h_2);
        }
      }
      pPVar3 = new_h_2;
      std::operator&(memory_order_release,__memory_order_mask);
      (this->mu_).super___atomic_base<long>._M_i = (__int_type)pPVar3;
      goto LAB_00117f9e;
    }
    if (wake_list == (PerThreadSynch *)0x0) {
      absl_raw_log_internal_basename_5 = (char *)0x0;
      pw_walk = *(PerThreadSynch **)nv_2;
    }
    else {
      absl_raw_log_internal_basename_5 = (char *)wake_list;
      pw_walk = wake_list->next;
    }
    *(undefined1 *)(nv_2 + 0x10) = 0;
    if (*(long *)(nv_2 + 8) != 0) {
      absl_raw_log_internal_basename_6 = "mutex.cc";
      absl::lts_20240722::raw_log_internal::RawLog
                (kFatal,"mutex.cc",0x8e2,"Check %s failed: %s","h->skip == nullptr",
                 "illegal skip from head");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x8e2,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
    }
    *(undefined1 *)(nv_2 + 0x13) = 1;
    std::operator&(memory_order_release,__memory_order_mask);
    (this->mu_).super___atomic_base<long>._M_i = (__int_type)pPVar3;
    wake_list = (PerThreadSynch *)nv_2;
    while (absl_raw_log_internal_basename_5 != (char *)nv_2) {
      pw_walk->wake = false;
      if ((pw_walk->waitp->cond == (Condition *)0x0) ||
         (bVar2 = EvalConditionIgnored(this,pw_walk->waitp->cond), bVar2)) {
        if (pw == (PerThreadSynch *)0x0) {
          pw_walk->wake = true;
          pw = pw_walk;
          old_h = (PerThreadSynch *)absl_raw_log_internal_basename_5;
          if (pw_walk->waitp->how == (MuHow)kExclusiveS) {
            absl_raw_log_internal_basename = (char *)0x20;
            break;
          }
        }
        else if (pw_walk->waitp->how == (MuHow)kSharedS) {
          pw_walk->wake = true;
        }
        else {
          absl_raw_log_internal_basename = (char *)0x20;
        }
      }
      if ((pw_walk->wake & 1U) == 0) {
        absl_raw_log_internal_basename_5 = (char *)Skip(pw_walk);
      }
      else {
        absl_raw_log_internal_basename_5 = (char *)pw_walk;
      }
      if (absl_raw_log_internal_basename_5 != (char *)nv_2) {
        pw_walk = *(PerThreadSynch **)absl_raw_log_internal_basename_5;
      }
    }
  } while( true );
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE void Mutex::UnlockSlow(SynchWaitParams* waitp) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  this->AssertReaderHeld();
  CheckForMutexCorruption(v, "Unlock");
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(
        this, (v & kMuWriter) != 0 ? SYNCH_EV_UNLOCK : SYNCH_EV_READERUNLOCK);
  }
  int c = 0;
  // the waiter under consideration to wake, or zero
  PerThreadSynch* w = nullptr;
  // the predecessor to w or zero
  PerThreadSynch* pw = nullptr;
  // head of the list searched previously, or zero
  PerThreadSynch* old_h = nullptr;
  // a condition that's known to be false.
  PerThreadSynch* wake_list = kPerThreadSynchNull;  // list of threads to wake
  intptr_t wr_wait = 0;  // set to kMuWrWait if we wake a reader and a
                         // later writer could have acquired the lock
                         // (starvation avoidance)
  ABSL_RAW_CHECK(waitp == nullptr || waitp->thread->waitp == nullptr ||
                     waitp->thread->suppress_fatal_errors,
                 "detected illegal recursion into Mutex code");
  // This loop finds threads wake_list to wakeup if any, and removes them from
  // the list of waiters.  In addition, it places waitp.thread on the queue of
  // waiters if waitp is non-zero.
  for (;;) {
    v = mu_.load(std::memory_order_relaxed);
    if ((v & kMuWriter) != 0 && (v & (kMuWait | kMuDesig)) != kMuWait &&
        waitp == nullptr) {
      // fast writer release (writer with no waiters or with designated waker)
      if (mu_.compare_exchange_strong(v, v & ~(kMuWrWait | kMuWriter),
                                      std::memory_order_release,
                                      std::memory_order_relaxed)) {
        return;
      }
    } else if ((v & (kMuReader | kMuWait)) == kMuReader && waitp == nullptr) {
      // fast reader release (reader with no waiters)
      intptr_t clear = ExactlyOneReader(v) ? kMuReader | kMuOne : kMuOne;
      if (mu_.compare_exchange_strong(v, v - clear, std::memory_order_release,
                                      std::memory_order_relaxed)) {
        return;
      }
    } else if ((v & kMuSpin) == 0 &&  // attempt to get spinlock
               mu_.compare_exchange_strong(v, v | kMuSpin,
                                           std::memory_order_acquire,
                                           std::memory_order_relaxed)) {
      if ((v & kMuWait) == 0) {  // no one to wake
        intptr_t nv;
        bool do_enqueue = true;  // always Enqueue() the first time
        ABSL_RAW_CHECK(waitp != nullptr,
                       "UnlockSlow is confused");  // about to sleep
        do {  // must loop to release spinlock as reader count may change
          v = mu_.load(std::memory_order_relaxed);
          // decrement reader count if there are readers
          intptr_t new_readers = (v >= kMuOne) ? v - kMuOne : v;
          PerThreadSynch* new_h = nullptr;
          if (do_enqueue) {
            // If we are enqueuing on a CondVar (waitp->cv_word != nullptr) then
            // we must not retry here.  The initial attempt will always have
            // succeeded, further attempts would enqueue us against *this due to
            // Fer() handling.
            do_enqueue = (waitp->cv_word == nullptr);
            new_h = Enqueue(nullptr, waitp, new_readers, kMuIsCond);
          }
          intptr_t clear = kMuWrWait | kMuWriter;  // by default clear write bit
          if ((v & kMuWriter) == 0 && ExactlyOneReader(v)) {  // last reader
            clear = kMuWrWait | kMuReader;                    // clear read bit
          }
          nv = (v & kMuLow & ~clear & ~kMuSpin);
          if (new_h != nullptr) {
            nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
          } else {  // new_h could be nullptr if we queued ourselves on a
                    // CondVar
            // In that case, we must place the reader count back in the mutex
            // word, as Enqueue() did not store it in the new waiter.
            nv |= new_readers & kMuHigh;
          }
          // release spinlock & our lock; retry if reader-count changed
          // (writer count cannot change since we hold lock)
        } while (!mu_.compare_exchange_weak(v, nv, std::memory_order_release,
                                            std::memory_order_relaxed));
        break;
      }

      // There are waiters.
      // Set h to the head of the circular waiter list.
      PerThreadSynch* h = GetPerThreadSynch(v);
      if ((v & kMuReader) != 0 && (h->readers & kMuHigh) > kMuOne) {
        // a reader but not the last
        h->readers -= kMuOne;    // release our lock
        intptr_t nv = v;         // normally just release spinlock
        if (waitp != nullptr) {  // but waitp!=nullptr => must queue ourselves
          PerThreadSynch* new_h = Enqueue(h, waitp, v, kMuIsCond);
          ABSL_RAW_CHECK(new_h != nullptr,
                         "waiters disappeared during Enqueue()!");
          nv &= kMuLow;
          nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
        }
        mu_.store(nv, std::memory_order_release);  // release spinlock
        // can release with a store because there were waiters
        break;
      }

      // Either we didn't search before, or we marked the queue
      // as "maybe_unlocking" and no one else should have changed it.
      ABSL_RAW_CHECK(old_h == nullptr || h->maybe_unlocking,
                     "Mutex queue changed beneath us");

      // The lock is becoming free, and there's a waiter
      if (old_h != nullptr &&
          !old_h->may_skip) {    // we used old_h as a terminator
        old_h->may_skip = true;  // allow old_h to skip once more
        ABSL_RAW_CHECK(old_h->skip == nullptr, "illegal skip from head");
        if (h != old_h && MuEquivalentWaiter(old_h, old_h->next)) {
          old_h->skip = old_h->next;  // old_h not head & can skip to successor
        }
      }
      if (h->next->waitp->how == kExclusive &&
          h->next->waitp->cond == nullptr) {
        // easy case: writer with no condition; no need to search
        pw = h;  // wake w, the successor of h (=pw)
        w = h->next;
        w->wake = true;
        // We are waking up a writer.  This writer may be racing against
        // an already awake reader for the lock.  We want the
        // writer to usually win this race,
        // because if it doesn't, we can potentially keep taking a reader
        // perpetually and writers will starve.  Worse than
        // that, this can also starve other readers if kMuWrWait gets set
        // later.
        wr_wait = kMuWrWait;
      } else if (w != nullptr && (w->waitp->how == kExclusive || h == old_h)) {
        // we found a waiter w to wake on a previous iteration and either it's
        // a writer, or we've searched the entire list so we have all the
        // readers.
        if (pw == nullptr) {  // if w's predecessor is unknown, it must be h
          pw = h;
        }
      } else {
        // At this point we don't know all the waiters to wake, and the first
        // waiter has a condition or is a reader.  We avoid searching over
        // waiters we've searched on previous iterations by starting at
        // old_h if it's set.  If old_h==h, there's no one to wakeup at all.
        if (old_h == h) {  // we've searched before, and nothing's new
                           // so there's no one to wake.
          intptr_t nv = (v & ~(kMuReader | kMuWriter | kMuWrWait));
          h->readers = 0;
          h->maybe_unlocking = false;  // finished unlocking
          if (waitp != nullptr) {      // we must queue ourselves and sleep
            PerThreadSynch* new_h = Enqueue(h, waitp, v, kMuIsCond);
            nv &= kMuLow;
            if (new_h != nullptr) {
              nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
            }  // else new_h could be nullptr if we queued ourselves on a
               // CondVar
          }
          // release spinlock & lock
          // can release with a store because there were waiters
          mu_.store(nv, std::memory_order_release);
          break;
        }

        // set up to walk the list
        PerThreadSynch* w_walk;   // current waiter during list walk
        PerThreadSynch* pw_walk;  // previous waiter during list walk
        if (old_h != nullptr) {  // we've searched up to old_h before
          pw_walk = old_h;
          w_walk = old_h->next;
        } else {  // no prior search, start at beginning
          pw_walk =
              nullptr;  // h->next's predecessor may change; don't record it
          w_walk = h->next;
        }

        h->may_skip = false;  // ensure we never skip past h in future searches
                              // even if other waiters are queued after it.
        ABSL_RAW_CHECK(h->skip == nullptr, "illegal skip from head");

        h->maybe_unlocking = true;  // we're about to scan the waiter list
                                    // without the spinlock held.
                                    // Enqueue must be conservative about
                                    // priority queuing.

        // We must release the spinlock to evaluate the conditions.
        mu_.store(v, std::memory_order_release);  // release just spinlock
        // can release with a store because there were waiters

        // h is the last waiter queued, and w_walk the first unsearched waiter.
        // Without the spinlock, the locations mu_ and h->next may now change
        // underneath us, but since we hold the lock itself, the only legal
        // change is to add waiters between h and w_walk.  Therefore, it's safe
        // to walk the path from w_walk to h inclusive. (TryRemove() can remove
        // a waiter anywhere, but it acquires both the spinlock and the Mutex)

        old_h = h;  // remember we searched to here

        // Walk the path upto and including h looking for waiters we can wake.
        while (pw_walk != h) {
          w_walk->wake = false;
          if (w_walk->waitp->cond ==
                  nullptr ||  // no condition => vacuously true OR
                              // this thread's condition is true
              EvalConditionIgnored(this, w_walk->waitp->cond)) {
            if (w == nullptr) {
              w_walk->wake = true;  // can wake this waiter
              w = w_walk;
              pw = pw_walk;
              if (w_walk->waitp->how == kExclusive) {
                wr_wait = kMuWrWait;
                break;  // bail if waking this writer
              }
            } else if (w_walk->waitp->how == kShared) {  // wake if a reader
              w_walk->wake = true;
            } else {  // writer with true condition
              wr_wait = kMuWrWait;
            }
          }
          if (w_walk->wake) {  // we're waking reader w_walk
            pw_walk = w_walk;  // don't skip similar waiters
          } else {             // not waking; skip as much as possible
            pw_walk = Skip(w_walk);
          }
          // If pw_walk == h, then load of pw_walk->next can race with
          // concurrent write in Enqueue(). However, at the same time
          // we do not need to do the load, because we will bail out
          // from the loop anyway.
          if (pw_walk != h) {
            w_walk = pw_walk->next;
          }
        }

        continue;  // restart for(;;)-loop to wakeup w or to find more waiters
      }
      ABSL_RAW_CHECK(pw->next == w, "pw not w's predecessor");
      // The first (and perhaps only) waiter we've chosen to wake is w, whose
      // predecessor is pw.  If w is a reader, we must wake all the other
      // waiters with wake==true as well.  We may also need to queue
      // ourselves if waitp != null.  The spinlock and the lock are still
      // held.

      // This traverses the list in [ pw->next, h ], where h is the head,
      // removing all elements with wake==true and placing them in the
      // singly-linked list wake_list.  Returns the new head.
      h = DequeueAllWakeable(h, pw, &wake_list);

      intptr_t nv = (v & kMuEvent) | kMuDesig;
      // assume no waiters left,
      // set kMuDesig for INV1a

      if (waitp != nullptr) {  // we must queue ourselves and sleep
        h = Enqueue(h, waitp, v, kMuIsCond);
        // h is new last waiter; could be null if we queued ourselves on a
        // CondVar
      }

      ABSL_RAW_CHECK(wake_list != kPerThreadSynchNull,
                     "unexpected empty wake list");

      if (h != nullptr) {  // there are waiters left
        h->readers = 0;
        h->maybe_unlocking = false;  // finished unlocking
        nv |= wr_wait | kMuWait | reinterpret_cast<intptr_t>(h);
      }

      // release both spinlock & lock
      // can release with a store because there were waiters
      mu_.store(nv, std::memory_order_release);
      break;  // out of for(;;)-loop
    }
    // aggressive here; no one can proceed till we do
    c = synchronization_internal::MutexDelay(c, AGGRESSIVE);
  }  // end of for(;;)-loop

  if (wake_list != kPerThreadSynchNull) {
    int64_t total_wait_cycles = 0;
    int64_t max_wait_cycles = 0;
    int64_t now = CycleClock::Now();
    do {
      // Profile lock contention events only if the waiter was trying to acquire
      // the lock, not waiting on a condition variable or Condition.
      if (!wake_list->cond_waiter) {
        int64_t cycles_waited =
            (now - wake_list->waitp->contention_start_cycles);
        total_wait_cycles += cycles_waited;
        if (max_wait_cycles == 0) max_wait_cycles = cycles_waited;
        wake_list->waitp->contention_start_cycles = now;
        wake_list->waitp->should_submit_contention_data = true;
      }
      wake_list = Wakeup(wake_list);  // wake waiters
    } while (wake_list != kPerThreadSynchNull);
    if (total_wait_cycles > 0) {
      mutex_tracer("slow release", this, total_wait_cycles);
      ABSL_TSAN_MUTEX_PRE_DIVERT(this, 0);
      submit_profile_data(total_wait_cycles);
      ABSL_TSAN_MUTEX_POST_DIVERT(this, 0);
    }
  }
}